

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<SizeComputer_&,_TransactionSerParams> *s,
          vector<CTxOut,_std::allocator<CTxOut>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  ParamsStream<SizeComputer_&,_TransactionSerParams> *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::size
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<ParamsStream<SizeComputer&,TransactionSerParams>>
            ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)in_stack_ffffffffffffffb8,
             (uint64_t)in_RSI);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin(in_RSI);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
         ::operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<ParamsStream<SizeComputer&,TransactionSerParams>,CTxOut>
              (in_stack_ffffffffffffffa8,(CTxOut *)0x47f4d3);
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }